

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void dumpULong(uint64_t value,bool inArray)

{
  int i;
  long lVar1;
  
  lVar1 = 0x38;
  do {
    printf("%02hhx ",value >> ((byte)lVar1 & 0x3f) & 0xff);
    lVar1 = lVar1 + -8;
  } while (lVar1 != -8);
  if (inArray) {
    putchar(0x20);
    return;
  }
  return;
}

Assistant:

void dumpULong(uint64_t value, bool inArray = false)
{
	for (int i = 56; i >= 0; i -= 8)
	{
		uint8_t v;
		v = (value >> i) & 0xff;
		printf("%02hhx ", v);
	}
	if (inArray)
	{
		printf(" ");
	}
}